

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
          (ArgBuilder *this,offset_in_ConfigData_to_bool field)

{
  BoundDataMember<Catch::ConfigData,_bool> *this_00;
  BoundArgFunction<Catch::ConfigData> local_20;
  offset_in_ConfigData_to_bool local_18;
  offset_in_ConfigData_to_bool field_local;
  ArgBuilder *this_local;
  
  local_18 = field;
  field_local = (offset_in_ConfigData_to_bool)this;
  this_00 = (BoundDataMember<Catch::ConfigData,_bool> *)operator_new(0x10);
  Detail::BoundDataMember<Catch::ConfigData,_bool>::BoundDataMember(this_00,local_18);
  Detail::BoundArgFunction<Catch::ConfigData>::BoundArgFunction
            (&local_20,(IArgFunction<Catch::ConfigData> *)this_00);
  Detail::BoundArgFunction<Catch::ConfigData>::operator=
            ((BoundArgFunction<Catch::ConfigData> *)this->m_arg,&local_20);
  Detail::BoundArgFunction<Catch::ConfigData>::~BoundArgFunction(&local_20);
  return;
}

Assistant:

void bind( bool C::* field ) {
                m_arg->boundField = new Detail::BoundDataMember<C,bool>( field );
            }